

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

istream * FIX::operator>>(istream *stream,SessionSettings *s)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  allocator<char> local_421;
  SessionSettings *local_420;
  string sessionQualifier;
  Sections section;
  Settings settings;
  Dictionary def;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  Dictionary dict;
  string local_250;
  BeginString beginString;
  SessionID sessionID;
  Dictionary local_88;
  
  settings.m_resolveEnvVars = s->m_resolveEnvVars;
  settings.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  settings.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  settings.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420 = s;
  operator>>(stream,&settings);
  section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessionID,"DEFAULT",(allocator<char> *)&dict);
  Settings::get((Sections *)&def,&settings,(string *)&sessionID);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::_M_move_assign(&section,&def);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)&def);
  std::__cxx11::string::~string((string *)&sessionID);
  def._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001fc688;
  def.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &def.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  def.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  def.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  def.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  def.m_name._M_dataplus._M_p = (pointer)&def.m_name.field_2;
  def.m_name._M_string_length = 0;
  def.m_name.field_2._M_local_buf[0] = '\0';
  def.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       def.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Dictionary::operator=
              (&def,section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  SessionSettings::set(local_420,&def);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessionID,"SESSION",(allocator<char> *)&beginString);
  Settings::get((Sections *)&dict,&settings,(string *)&sessionID);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::_M_move_assign(&section,&dict);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)&dict);
  std::__cxx11::string::~string((string *)&sessionID);
  dict._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001fc688;
  dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dict.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dict.m_name._M_dataplus._M_p = (pointer)&dict.m_name.field_2;
  dict.m_name._M_string_length = 0;
  dict.m_name.field_2._M_local_buf[0] = '\0';
  lVar2 = 0;
  uVar3 = 0;
  dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dict.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((ulong)(((long)section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)section.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x58) <= uVar3) break;
    Dictionary::operator=
              (&dict,(Dictionary *)
                     ((long)&(section.
                              super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                              _M_impl.super__Vector_impl_data._M_start)->_vptr_Dictionary + lVar2));
    Dictionary::merge(&dict,&def);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&senderCompID,"BeginString",(allocator<char> *)&targetCompID);
    Dictionary::getString((string *)&sessionID,&dict,(string *)&senderCompID,false);
    BeginString::BeginString(&beginString,(STRING *)&sessionID);
    std::__cxx11::string::~string((string *)&sessionID);
    std::__cxx11::string::~string((string *)&senderCompID);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetCompID,"SenderCompID",(allocator<char> *)&sessionQualifier);
    Dictionary::getString((string *)&sessionID,&dict,(string *)&targetCompID,false);
    SenderCompID::SenderCompID(&senderCompID,(STRING *)&sessionID);
    std::__cxx11::string::~string((string *)&sessionID);
    std::__cxx11::string::~string((string *)&targetCompID);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sessionQualifier,"TargetCompID",(allocator<char> *)&local_250);
    Dictionary::getString((string *)&sessionID,&dict,&sessionQualifier,false);
    TargetCompID::TargetCompID(&targetCompID,(STRING *)&sessionID);
    std::__cxx11::string::~string((string *)&sessionID);
    std::__cxx11::string::~string((string *)&sessionQualifier);
    sessionQualifier._M_dataplus._M_p = (pointer)&sessionQualifier.field_2;
    sessionQualifier._M_string_length = 0;
    sessionQualifier.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sessionID,"SessionQualifier",(allocator<char> *)&local_250);
    bVar1 = Dictionary::has(&dict,(string *)&sessionID);
    std::__cxx11::string::~string((string *)&sessionID);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"SessionQualifier",&local_421);
      Dictionary::getString((string *)&sessionID,&dict,&local_250,false);
      std::__cxx11::string::operator=((string *)&sessionQualifier,(string *)&sessionID);
      std::__cxx11::string::~string((string *)&sessionID);
      std::__cxx11::string::~string((string *)&local_250);
    }
    SessionID::SessionID
              (&sessionID,&beginString.super_StringField.super_FieldBase.m_string,
               &senderCompID.super_StringField.super_FieldBase.m_string,
               &targetCompID.super_StringField.super_FieldBase.m_string,&sessionQualifier);
    Dictionary::Dictionary(&local_88,&dict);
    SessionSettings::set(local_420,&sessionID,&local_88);
    Dictionary::~Dictionary(&local_88);
    SessionID::~SessionID(&sessionID);
    std::__cxx11::string::~string((string *)&sessionQualifier);
    FieldBase::~FieldBase((FieldBase *)&targetCompID);
    FieldBase::~FieldBase((FieldBase *)&senderCompID);
    FieldBase::~FieldBase((FieldBase *)&beginString);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x58;
  }
  Dictionary::~Dictionary(&dict);
  Dictionary::~Dictionary(&def);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&section);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&settings.m_sections);
  return stream;
}

Assistant:

EXCEPT(ConfigError) {
  Settings settings(s.m_resolveEnvVars);
  stream >> settings;

  Settings::Sections section;

  section = settings.get("DEFAULT");
  Dictionary def;
  if (section.size()) {
    def = section[0];
  }
  s.set(def);

  section = settings.get("SESSION");
  Settings::Sections::size_type session;
  Dictionary dict;

  for (session = 0; session < section.size(); ++session) {
    dict = section[session];
    dict.merge(def);

    BeginString beginString(dict.getString(BEGINSTRING));
    SenderCompID senderCompID(dict.getString(SENDERCOMPID));
    TargetCompID targetCompID(dict.getString(TARGETCOMPID));

    std::string sessionQualifier;
    if (dict.has(SESSION_QUALIFIER)) {
      sessionQualifier = dict.getString(SESSION_QUALIFIER);
    }
    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    s.set(sessionID, dict);
  }
  return stream;
}